

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::NewFrame(void)

{
  float *pfVar1;
  ImVec2 *pIVar2;
  int *piVar3;
  ImGuiNextWindowData *pIVar4;
  ImGuiNavItemData *pIVar5;
  ImVec2 *pIVar6;
  float fVar7;
  float fVar8;
  ImGuiContextHook *pIVar9;
  ImFontAtlas *pIVar10;
  uint *puVar11;
  ImGuiViewportP *pIVar12;
  ImGuiTableTempData *pIVar13;
  ImGuiWindow **ppIVar14;
  ImGuiPopupData *pIVar15;
  ImGuiGroupData *pIVar16;
  undefined1 auVar17 [12];
  byte bVar18;
  ImGuiContext *pIVar19;
  ImGuiContext *pIVar20;
  ImGuiContext *pIVar21;
  ImGuiID IVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  uint uVar27;
  ImGuiID IVar28;
  ImGuiInputSource IVar29;
  ImGuiContext *ctx;
  uint *__dest;
  ImGuiWindow *pIVar30;
  ImGuiWindow **__dest_00;
  ImGuiPopupData *__dest_01;
  int *piVar31;
  int *piVar32;
  ImGuiGroupData *__dest_02;
  int i;
  int iVar33;
  ImGuiID IVar34;
  ImGuiWindow *window_00;
  char *pcVar35;
  ImGuiWindow *parent;
  ImGuiWindow *pIVar36;
  ImGuiContext *g;
  int i_1;
  int iVar37;
  ImGuiDir IVar38;
  ImRect *pIVar39;
  ImGuiID IVar40;
  float *pfVar41;
  ImGuiNavDirSourceFlags dir_sources;
  ImGuiNavLayer IVar42;
  ImGuiID IVar43;
  ImFont *font;
  float *pfVar44;
  long lVar45;
  long lVar46;
  ImGuiContext *g_2;
  ImGuiWindow *old_nav_window;
  ImGuiWindow *window;
  ulong uVar47;
  long lVar48;
  ImGuiNavItemData *pIVar49;
  bool *pbVar50;
  ImGuiContext *pIVar51;
  ImGuiContext *g_1;
  long lVar52;
  byte bVar53;
  uint uVar54;
  float fVar55;
  ImVec2 IVar56;
  ImVec2 IVar57;
  ImVec2 IVar58;
  ImVec2 IVar60;
  undefined1 auVar61 [16];
  double dVar59;
  undefined1 auVar62 [16];
  float fVar63;
  float fVar64;
  float fVar65;
  undefined1 auVar66 [16];
  float fVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar71;
  float fVar74;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  ImRect local_48;
  
  pIVar19 = GImGui;
  bVar53 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0xf44,"void ImGui::NewFrame()");
  }
  uVar27 = (GImGui->Hooks).Size;
  uVar47 = (ulong)(int)uVar27;
  if (0 < (long)uVar47) {
    lVar52 = -uVar47;
    lVar48 = uVar47 << 5;
    do {
      if ((long)(int)uVar27 < (long)uVar47) {
        pcVar35 = "T &ImVector<ImGuiContextHook>::operator[](int) [T = ImGuiContextHook]";
        goto LAB_001440a5;
      }
      pIVar9 = (pIVar19->Hooks).Data;
      if (*(int *)(pIVar9 + lVar48 + -0x1c) == 7) {
        memmove(pIVar9 + lVar48 + -0x20,pIVar9 + lVar48,((ulong)uVar27 + lVar52) * 0x20);
        uVar27 = (pIVar19->Hooks).Size - 1;
        (pIVar19->Hooks).Size = uVar27;
      }
      lVar52 = lVar52 + 1;
      bVar23 = 1 < uVar47;
      uVar47 = uVar47 - 1;
      lVar48 = lVar48 + -0x20;
    } while (bVar23);
    if (0 < (int)uVar27) {
      lVar48 = 0;
      lVar52 = 0;
      do {
        pIVar9 = (pIVar19->Hooks).Data;
        if (*(int *)(pIVar9 + lVar48 + 4) == 0) {
          (**(code **)(pIVar9 + lVar48 + 0x10))(pIVar19,pIVar9 + lVar48);
          uVar27 = (pIVar19->Hooks).Size;
        }
        lVar52 = lVar52 + 1;
        lVar48 = lVar48 + 0x20;
      } while (lVar52 < (int)uVar27);
    }
  }
  pIVar51 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x1bf1,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  iVar37 = GImGui->FrameCount;
  if ((GImGui->IO).DeltaTime <= 0.0) {
    if (iVar37 != 0) {
      __assert_fail("(g.IO.DeltaTime > 0.0f || g.FrameCount == 0) && \"Need a positive DeltaTime!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                    ,0x1bf2,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
  }
  else if ((iVar37 != 0) && (GImGui->FrameCountEnded != iVar37)) {
    __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x1bf3,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x1bf4,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  pIVar10 = (GImGui->IO).Fonts;
  if ((pIVar10->Fonts).Size < 1) {
    __assert_fail("g.IO.Fonts->Fonts.Size > 0 && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8()?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x1bf5,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((*(pIVar10->Fonts).Data)->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.IO.Fonts->Fonts[0]->IsLoaded() && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8()?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x1bf6,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x1bf7,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->Style).CircleTessellationMaxError <= 0.0) {
    __assert_fail("g.Style.CircleTessellationMaxError > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x1bf8,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  fVar55 = (GImGui->Style).Alpha;
  if ((fVar55 < 0.0) || (1.0 < fVar55)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x1bf9,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->Style).WindowMinSize.x < 1.0) || ((GImGui->Style).WindowMinSize.y < 1.0)) {
    __assert_fail("g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && \"Invalid style setting.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x1bfa,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (2 < (GImGui->Style).WindowMenuButtonPosition + 1U) {
    __assert_fail("g.Style.WindowMenuButtonPosition == ImGuiDir_None || g.Style.WindowMenuButtonPosition == ImGuiDir_Left || g.Style.WindowMenuButtonPosition == ImGuiDir_Right"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x1bfb,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  lVar48 = 0;
  do {
    if (0x200 < (GImGui->IO).KeyMap[lVar48] + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ((int)(sizeof(g.IO.KeysDown) / sizeof(*(g.IO.KeysDown)))) && \"io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                    ,0x1bfd,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    lVar48 = lVar48 + 1;
  } while (lVar48 != 0x16);
  if ((((GImGui->IO).ConfigFlags & 1) != 0) && ((GImGui->IO).KeyMap[0xc] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x1c01,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).ConfigWindowsResizeFromEdges == true) && (((GImGui->IO).BackendFlags & 2) == 0))
  {
    (GImGui->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (pIVar51->SettingsLoaded == false) {
    if ((pIVar51->SettingsWindows).Buf.Size != 0) {
      __assert_fail("g.SettingsWindows.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                    ,0x2868,"void ImGui::UpdateSettings()");
    }
    pcVar35 = (pIVar51->IO).IniFilename;
    if (pcVar35 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar35);
    }
    pIVar51->SettingsLoaded = true;
  }
  if ((0.0 < pIVar51->SettingsDirtyTimer) &&
     (fVar55 = pIVar51->SettingsDirtyTimer - (pIVar51->IO).DeltaTime,
     pIVar51->SettingsDirtyTimer = fVar55, fVar55 <= 0.0)) {
    pcVar35 = (pIVar51->IO).IniFilename;
    if (pcVar35 == (char *)0x0) {
      (pIVar51->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar35);
    }
    pIVar51->SettingsDirtyTimer = 0.0;
  }
  fVar55 = (pIVar19->IO).DeltaTime;
  pIVar19->Time = (double)fVar55 + pIVar19->Time;
  pIVar19->WithinFrameScope = true;
  pIVar19->FrameCount = pIVar19->FrameCount + 1;
  pIVar19->TooltipOverrideCount = 0;
  pIVar19->WindowsActiveCount = 0;
  if ((pIVar19->MenusIdSubmittedThisFrame).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar32 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar32 = *piVar32 + 1;
    }
    __dest = (uint *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    puVar11 = (pIVar19->MenusIdSubmittedThisFrame).Data;
    if (puVar11 != (uint *)0x0) {
      memcpy(__dest,puVar11,(long)(pIVar19->MenusIdSubmittedThisFrame).Size << 2);
      puVar11 = (pIVar19->MenusIdSubmittedThisFrame).Data;
      if ((puVar11 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar32 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar32 = *piVar32 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar11,GImAllocatorUserData);
    }
    (pIVar19->MenusIdSubmittedThisFrame).Data = __dest;
    (pIVar19->MenusIdSubmittedThisFrame).Capacity = 0;
    fVar55 = (pIVar19->IO).DeltaTime;
  }
  pIVar51 = GImGui;
  (pIVar19->MenusIdSubmittedThisFrame).Size = 0;
  iVar37 = pIVar19->FramerateSecPerFrameIdx;
  pIVar19->FramerateSecPerFrameAccum =
       (fVar55 - pIVar19->FramerateSecPerFrame[iVar37]) + pIVar19->FramerateSecPerFrameAccum;
  pIVar19->FramerateSecPerFrame[iVar37] = fVar55;
  iVar33 = iVar37 + (int)((ulong)((long)(iVar37 + 1) * -0x77777777) >> 0x20) + 1;
  pIVar19->FramerateSecPerFrameIdx = iVar37 + 1 + ((iVar33 >> 6) - (iVar33 >> 0x1f)) * -0x78;
  iVar37 = 0x77;
  if (pIVar19->FramerateSecPerFrameCount < 0x77) {
    iVar37 = pIVar19->FramerateSecPerFrameCount;
  }
  pIVar19->FramerateSecPerFrameCount = iVar37 + 1;
  uVar27 = -(uint)(0.0 < pIVar19->FramerateSecPerFrameAccum);
  (pIVar19->IO).Framerate =
       (float)(~uVar27 & 0x7f7fffff |
              (uint)(1.0 / (pIVar19->FramerateSecPerFrameAccum / (float)(iVar37 + 1))) & uVar27);
  if ((pIVar51->Viewports).Size != 1) {
    __assert_fail("g.Viewports.Size == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x2997,"void ImGui::UpdateViewportsNewFrame()");
  }
  pIVar12 = *(pIVar51->Viewports).Data;
  (pIVar12->super_ImGuiViewport).Flags = 5;
  (pIVar12->super_ImGuiViewport).Pos.x = 0.0;
  (pIVar12->super_ImGuiViewport).Pos.y = 0.0;
  (pIVar12->super_ImGuiViewport).Size = (pIVar51->IO).DisplaySize;
  if (0 < (pIVar51->Viewports).Size) {
    lVar48 = 0;
    do {
      pIVar12 = (pIVar51->Viewports).Data[lVar48];
      IVar57 = pIVar12->BuildWorkOffsetMin;
      pIVar12->WorkOffsetMin = IVar57;
      IVar58 = pIVar12->BuildWorkOffsetMax;
      pIVar12->WorkOffsetMax = IVar58;
      (pIVar12->BuildWorkOffsetMin).x = 0.0;
      (pIVar12->BuildWorkOffsetMin).y = 0.0;
      (pIVar12->BuildWorkOffsetMax).x = 0.0;
      (pIVar12->BuildWorkOffsetMax).y = 0.0;
      IVar56 = (pIVar12->super_ImGuiViewport).Size;
      fVar55 = IVar58.x + (IVar56.x - IVar57.x);
      fVar74 = IVar58.y + (IVar56.y - IVar57.y);
      IVar56 = (pIVar12->super_ImGuiViewport).Pos;
      (pIVar12->super_ImGuiViewport).WorkPos.x = IVar56.x + IVar57.x;
      (pIVar12->super_ImGuiViewport).WorkPos.y = IVar56.y + IVar57.y;
      (pIVar12->super_ImGuiViewport).WorkSize.x = (float)(-(uint)(0.0 < fVar55) & (uint)fVar55);
      (pIVar12->super_ImGuiViewport).WorkSize.y = (float)(-(uint)(0.0 < fVar74) & (uint)fVar74);
      lVar48 = lVar48 + 1;
    } while (lVar48 < (pIVar51->Viewports).Size);
  }
  ((pIVar19->IO).Fonts)->Locked = true;
  font = (GImGui->IO).FontDefault;
  if (font == (ImFont *)0x0) {
    pIVar10 = (GImGui->IO).Fonts;
    if ((pIVar10->Fonts).Size < 1) {
      pcVar35 = "T &ImVector<ImFont *>::operator[](int) [T = ImFont *]";
LAB_001440a5:
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                    ,0x68b,pcVar35);
    }
    font = *(pIVar10->Fonts).Data;
  }
  SetCurrentFont(font);
  if (pIVar19->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0xf68,"void ImGui::NewFrame()");
  }
  lVar48 = (long)(pIVar19->Viewports).Size;
  if (lVar48 < 1) {
    fVar55 = 3.4028235e+38;
    fVar74 = 3.4028235e+38;
    fVar65 = -3.4028235e+38;
    fVar71 = -3.4028235e+38;
  }
  else {
    fVar55 = 3.4028235e+38;
    fVar74 = 3.4028235e+38;
    fVar65 = -3.4028235e+38;
    fVar71 = -3.4028235e+38;
    lVar52 = 0;
    do {
      pIVar12 = (pIVar19->Viewports).Data[lVar52];
      fVar67 = (pIVar12->super_ImGuiViewport).Pos.x;
      if (fVar67 < fVar55) {
        fVar55 = fVar67;
      }
      fVar63 = (pIVar12->super_ImGuiViewport).Pos.y;
      if (fVar63 < fVar74) {
        fVar74 = fVar63;
      }
      fVar67 = fVar67 + (pIVar12->super_ImGuiViewport).Size.x;
      if (fVar65 < fVar67) {
        fVar65 = fVar67;
      }
      fVar63 = fVar63 + (pIVar12->super_ImGuiViewport).Size.y;
      if (fVar71 < fVar63) {
        fVar71 = fVar63;
      }
      lVar52 = lVar52 + 1;
    } while (lVar48 != lVar52);
  }
  (pIVar19->DrawListSharedData).ClipRectFullscreen.x = fVar55;
  (pIVar19->DrawListSharedData).ClipRectFullscreen.y = fVar74;
  (pIVar19->DrawListSharedData).ClipRectFullscreen.z = fVar65;
  (pIVar19->DrawListSharedData).ClipRectFullscreen.w = fVar71;
  fVar55 = (pIVar19->Style).CircleTessellationMaxError;
  (pIVar19->DrawListSharedData).CurveTessellationTol = (pIVar19->Style).CurveTessellationTol;
  ImDrawListSharedData::SetCircleTessellationMaxError(&pIVar19->DrawListSharedData,fVar55);
  bVar23 = (pIVar19->Style).AntiAliasedLines;
  uVar27 = (uint)bVar23;
  (pIVar19->DrawListSharedData).InitialFlags = (uint)bVar23;
  if (((pIVar19->Style).AntiAliasedLinesUseTex != false) &&
     ((pIVar19->Font->ContainerAtlas->Flags & 4) == 0)) {
    uVar27 = bVar23 | 2;
    (pIVar19->DrawListSharedData).InitialFlags = uVar27;
  }
  if ((pIVar19->Style).AntiAliasedFill == true) {
    uVar27 = uVar27 | 4;
    (pIVar19->DrawListSharedData).InitialFlags = uVar27;
  }
  if (((pIVar19->IO).BackendFlags & 8) != 0) {
    (pIVar19->DrawListSharedData).InitialFlags = uVar27 | 8;
  }
  if (0 < (pIVar19->Viewports).Size) {
    lVar48 = 0;
    do {
      pIVar12 = (pIVar19->Viewports).Data[lVar48];
      (pIVar12->DrawDataP).DisplaySize.x = 0.0;
      (pIVar12->DrawDataP).DisplaySize.y = 0.0;
      (pIVar12->DrawDataP).FramebufferScale.x = 0.0;
      (pIVar12->DrawDataP).FramebufferScale.y = 0.0;
      (pIVar12->DrawDataP).CmdLists = (ImDrawList **)0x0;
      (pIVar12->DrawDataP).DisplayPos.x = 0.0;
      (pIVar12->DrawDataP).DisplayPos.y = 0.0;
      (pIVar12->DrawDataP).Valid = false;
      *(undefined3 *)&(pIVar12->DrawDataP).field_0x1 = 0;
      (pIVar12->DrawDataP).CmdListsCount = 0;
      (pIVar12->DrawDataP).TotalIdxCount = 0;
      (pIVar12->DrawDataP).TotalVtxCount = 0;
      lVar48 = lVar48 + 1;
    } while (lVar48 < (pIVar19->Viewports).Size);
  }
  pIVar51 = GImGui;
  if ((pIVar19->DragDropActive != false) &&
     (IVar34 = (pIVar19->DragDropPayload).SourceId, IVar34 == pIVar19->ActiveId)) {
    if (GImGui->ActiveId == IVar34) {
      GImGui->ActiveIdIsAlive = IVar34;
    }
    if (pIVar51->ActiveIdPreviousFrame == IVar34) {
      pIVar51->ActiveIdPreviousFrameIsAlive = true;
    }
  }
  if (pIVar19->HoveredIdPreviousFrame == 0) {
    IVar34 = pIVar19->HoveredId;
    pIVar19->HoveredIdTimer = 0.0;
    pIVar19->HoveredIdNotActiveTimer = 0.0;
    if (IVar34 == 0) goto LAB_001414a1;
LAB_0014147a:
    fVar55 = (pIVar19->IO).DeltaTime;
    pIVar19->HoveredIdTimer = pIVar19->HoveredIdTimer + fVar55;
    IVar28 = IVar34;
    if (pIVar19->ActiveId != IVar34) {
      pIVar19->HoveredIdNotActiveTimer = fVar55 + pIVar19->HoveredIdNotActiveTimer;
      IVar28 = pIVar19->ActiveId;
    }
  }
  else {
    IVar34 = pIVar19->HoveredId;
    if (IVar34 != 0) {
      if (pIVar19->ActiveId == IVar34) {
        pIVar19->HoveredIdNotActiveTimer = 0.0;
      }
      goto LAB_0014147a;
    }
LAB_001414a1:
    IVar34 = 0;
    IVar28 = pIVar19->ActiveId;
  }
  pIVar19->HoveredIdPreviousFrame = IVar34;
  pIVar19->HoveredIdPreviousFrameUsingMouseWheel = pIVar19->HoveredIdUsingMouseWheel;
  pIVar19->HoveredId = 0;
  pIVar19->HoveredIdAllowOverlap = false;
  pIVar19->HoveredIdUsingMouseWheel = false;
  pIVar19->HoveredIdDisabled = false;
  if (((pIVar19->ActiveIdIsAlive != IVar28) && (IVar28 != 0)) &&
     (pIVar19->ActiveIdPreviousFrame == IVar28)) {
    SetActiveID(0,(ImGuiWindow *)0x0);
    IVar28 = pIVar19->ActiveId;
  }
  fVar55 = (pIVar19->IO).DeltaTime;
  if (IVar28 != 0) {
    pIVar19->ActiveIdTimer = pIVar19->ActiveIdTimer + fVar55;
  }
  pIVar19->LastActiveIdTimer = pIVar19->LastActiveIdTimer + fVar55;
  pIVar19->ActiveIdPreviousFrame = IVar28;
  pIVar19->ActiveIdPreviousFrameWindow = pIVar19->ActiveIdWindow;
  pIVar19->ActiveIdPreviousFrameHasBeenEditedBefore = pIVar19->ActiveIdHasBeenEditedBefore;
  pIVar19->ActiveIdIsAlive = 0;
  pIVar19->ActiveIdHasBeenEditedThisFrame = false;
  pIVar19->ActiveIdPreviousFrameIsAlive = false;
  pIVar19->ActiveIdIsJustActivated = false;
  if (pIVar19->TempInputId == 0) {
LAB_00141591:
    if (IVar28 == 0) {
      pIVar19->ActiveIdUsingNavDirMask = 0;
      pIVar19->ActiveIdUsingNavInputMask = 0;
      pIVar19->ActiveIdUsingKeyInputMask = 0;
    }
  }
  else if (IVar28 != pIVar19->TempInputId) {
    pIVar19->TempInputId = 0;
    goto LAB_00141591;
  }
  pIVar19->DragDropAcceptIdPrev = pIVar19->DragDropAcceptIdCurr;
  pIVar19->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar19->DragDropAcceptIdCurr = 0;
  pIVar19->DragDropWithinSource = false;
  pIVar19->DragDropWithinTarget = false;
  pIVar19->DragDropHoldJustPressedId = 0;
  pIVar51 = GImGui;
  bVar23 = (GImGui->IO).KeyCtrl;
  uVar27 = bVar23 + 2;
  if ((GImGui->IO).KeyShift == false) {
    uVar27 = (uint)bVar23;
  }
  uVar54 = uVar27 + 4;
  if ((GImGui->IO).KeyAlt == false) {
    uVar54 = uVar27;
  }
  uVar27 = uVar54 + 8;
  if ((GImGui->IO).KeySuper == false) {
    uVar27 = uVar54;
  }
  (pIVar19->IO).KeyMods = uVar27;
  memcpy((pIVar19->IO).KeysDownDurationPrev,(pIVar19->IO).KeysDownDuration,0x800);
  lVar48 = 0x144;
  do {
    fVar74 = -1.0;
    if (*(char *)((long)(pIVar19->IO).KeyMap + lVar48 + -0x3c) == '\x01') {
      fVar65 = *(float *)((long)pIVar19 + lVar48 * 4 + -0x70);
      fVar74 = 0.0;
      if (0.0 <= fVar65) {
        fVar74 = fVar65 + fVar55;
      }
    }
    *(float *)((long)pIVar19 + lVar48 * 4 + -0x70) = fVar74;
    lVar48 = lVar48 + 1;
  } while (lVar48 != 0x344);
  (pIVar51->IO).WantSetMousePos = false;
  pIVar51->NavWrapRequestWindow = (ImGuiWindow *)0x0;
  pIVar51->NavWrapRequestFlags = 0;
  uVar27 = (pIVar51->IO).ConfigFlags;
  if (((uVar27 & 2) == 0) || (((pIVar51->IO).BackendFlags & 1) == 0)) {
    bVar18 = 0;
  }
  else {
    bVar18 = 1;
    if ((pIVar51->NavInputSource != ImGuiInputSource_Gamepad) &&
       (((bVar18 = 1, 0.0 < (pIVar51->IO).NavInputs[0] || (0.0 < (pIVar51->IO).NavInputs[2])) ||
        ((0.0 < (pIVar51->IO).NavInputs[1] ||
         ((((0.0 < (pIVar51->IO).NavInputs[3] || (0.0 < (pIVar51->IO).NavInputs[4])) ||
           (0.0 < (pIVar51->IO).NavInputs[5])) ||
          ((0.0 < (pIVar51->IO).NavInputs[6] || (0.0 < (pIVar51->IO).NavInputs[7])))))))))) {
      pIVar51->NavInputSource = ImGuiInputSource_Gamepad;
    }
  }
  if ((uVar27 & 1) != 0) {
    uVar54 = (pIVar51->IO).KeyMap[0xc];
    if (-1 < (long)(int)uVar54) {
      if (0x1ff < uVar54) goto LAB_001440af;
      if ((pIVar51->IO).KeysDown[(int)uVar54] == true) {
        (pIVar51->IO).NavInputs[0] = 1.0;
        pIVar51->NavInputSource = ImGuiInputSource_Keyboard;
      }
    }
    uVar54 = (pIVar51->IO).KeyMap[0xd];
    if (-1 < (long)(int)uVar54) {
      if (0x1ff < uVar54) goto LAB_001440af;
      if ((pIVar51->IO).KeysDown[(int)uVar54] == true) {
        (pIVar51->IO).NavInputs[2] = 1.0;
        pIVar51->NavInputSource = ImGuiInputSource_Keyboard;
      }
    }
    uVar54 = (pIVar51->IO).KeyMap[0xe];
    if (-1 < (long)(int)uVar54) {
      if (0x1ff < uVar54) goto LAB_001440af;
      if ((pIVar51->IO).KeysDown[(int)uVar54] == true) {
        (pIVar51->IO).NavInputs[1] = 1.0;
        pIVar51->NavInputSource = ImGuiInputSource_Keyboard;
      }
    }
    uVar54 = (pIVar51->IO).KeyMap[1];
    if (-1 < (long)(int)uVar54) {
      if (0x1ff < uVar54) goto LAB_001440af;
      if ((pIVar51->IO).KeysDown[(int)uVar54] == true) {
        (pIVar51->IO).NavInputs[0x11] = 1.0;
        pIVar51->NavInputSource = ImGuiInputSource_Keyboard;
      }
    }
    uVar54 = (pIVar51->IO).KeyMap[2];
    if (-1 < (long)(int)uVar54) {
      if (0x1ff < uVar54) goto LAB_001440af;
      if ((pIVar51->IO).KeysDown[(int)uVar54] == true) {
        (pIVar51->IO).NavInputs[0x12] = 1.0;
        pIVar51->NavInputSource = ImGuiInputSource_Keyboard;
      }
    }
    uVar54 = (pIVar51->IO).KeyMap[3];
    if (-1 < (long)(int)uVar54) {
      if (0x1ff < uVar54) goto LAB_001440af;
      if ((pIVar51->IO).KeysDown[(int)uVar54] == true) {
        (pIVar51->IO).NavInputs[0x13] = 1.0;
        pIVar51->NavInputSource = ImGuiInputSource_Keyboard;
      }
    }
    uVar54 = (pIVar51->IO).KeyMap[4];
    if (-1 < (long)(int)uVar54) {
      if (0x1ff < uVar54) {
LAB_001440af:
        __assert_fail("user_key_index >= 0 && user_key_index < ((int)(sizeof(g.IO.KeysDown) / sizeof(*(g.IO.KeysDown))))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                      ,0x1226,"bool ImGui::IsKeyDown(int)");
      }
      if ((pIVar51->IO).KeysDown[(int)uVar54] == true) {
        (pIVar51->IO).NavInputs[0x14] = 1.0;
        pIVar51->NavInputSource = ImGuiInputSource_Keyboard;
      }
    }
    bVar23 = (pIVar51->IO).KeyCtrl;
    if (bVar23 == true) {
      (pIVar51->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar51->IO).KeyShift == true) {
      (pIVar51->IO).NavInputs[0xf] = 1.0;
    }
    if (((bVar23 == false) && ((pIVar51->IO).KeyAlt != false)) &&
       (((pIVar51->IO).NavInputs[0x10] = 1.0, pIVar51->NavWindowingToggleLayer == true &&
        (0 < (pIVar51->IO).InputQueueCharacters.Size)))) {
      pIVar51->NavWindowingToggleLayer = false;
    }
  }
  pfVar1 = (pIVar51->IO).NavInputsDownDuration;
  pfVar41 = pfVar1;
  pfVar44 = (pIVar51->IO).NavInputsDownDurationPrev;
  for (lVar48 = 0x15; lVar48 != 0; lVar48 = lVar48 + -1) {
    *pfVar44 = *pfVar41;
    pfVar41 = pfVar41 + (ulong)bVar53 * -2 + 1;
    pfVar44 = pfVar44 + (ulong)bVar53 * -2 + 1;
  }
  lVar48 = 0;
  do {
    fVar55 = -1.0;
    if (0.0 < (pIVar51->IO).NavInputs[lVar48]) {
      fVar55 = 0.0;
      if (0.0 <= pfVar1[lVar48]) {
        fVar55 = pfVar1[lVar48] + (pIVar51->IO).DeltaTime;
      }
    }
    pfVar1[lVar48] = fVar55;
    lVar48 = lVar48 + 1;
  } while (lVar48 != 0x15);
  if (((pIVar51->NavInitResultId != 0) && (pIVar51->NavWindow != (ImGuiWindow *)0x0)) &&
     (SetNavID(pIVar51->NavInitResultId,pIVar51->NavLayer,0,&pIVar51->NavInitResultRectRel),
     pIVar51->NavInitRequestFromMove == true)) {
    pIVar51->NavMousePosDirty = true;
    pIVar51->NavDisableHighlight = false;
    pIVar51->NavDisableMouseHover = true;
  }
  pIVar51->NavInitRequest = false;
  pIVar51->NavInitRequestFromMove = false;
  pIVar51->NavInitResultId = 0;
  pIVar51->NavJustMovedToId = 0;
  pIVar20 = GImGui;
  if (pIVar51->NavMoveRequest == true) {
    IVar34 = (GImGui->NavMoveResultLocal).ID;
    if ((IVar34 == 0) && ((GImGui->NavMoveResultOther).ID == 0)) {
      if (GImGui->NavId == 0) goto LAB_00141bb3;
      GImGui->NavDisableHighlight = false;
    }
    else {
      pIVar5 = &GImGui->NavMoveResultOther;
      pIVar49 = &GImGui->NavMoveResultLocal;
      if (IVar34 == 0) {
        pIVar49 = pIVar5;
      }
      if ((((GImGui->NavMoveRequestFlags & 0x20U) != 0) &&
          (IVar34 = (GImGui->NavMoveResultLocalVisibleSet).ID, IVar34 != 0)) &&
         (IVar34 != GImGui->NavId)) {
        pIVar49 = &GImGui->NavMoveResultLocalVisibleSet;
      }
      if (pIVar49 == pIVar5) {
LAB_001419fd:
        pIVar49 = pIVar5;
      }
      else if (((GImGui->NavMoveResultOther).ID != 0) &&
              (((GImGui->NavMoveResultOther).Window)->ParentWindow == GImGui->NavWindow)) {
        fVar55 = (GImGui->NavMoveResultOther).DistBox;
        fVar74 = pIVar49->DistBox;
        if (fVar74 <= fVar55) {
          if (((fVar55 != fVar74) || (NAN(fVar55) || NAN(fVar74))) ||
             (pfVar1 = &(GImGui->NavMoveResultOther).DistCenter,
             pIVar49->DistCenter < *pfVar1 || pIVar49->DistCenter == *pfVar1)) goto LAB_00141a00;
        }
        goto LAB_001419fd;
      }
LAB_00141a00:
      if ((GImGui->NavWindow == (ImGuiWindow *)0x0) ||
         (pIVar30 = pIVar49->Window, pIVar30 == (ImGuiWindow *)0x0)) {
        __assert_fail("g.NavWindow && result->Window",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                      ,0x248a,"void ImGui::NavUpdateMoveResult()");
      }
      if (GImGui->NavLayer == ImGuiNavLayer_Main) {
        if ((GImGui->NavMoveRequestFlags & 0x40U) == 0) {
          IVar56 = (pIVar49->RectRel).Min;
          IVar57 = (pIVar49->RectRel).Max;
          fVar55 = (pIVar30->Pos).x;
          local_48.Min.x = IVar56.x + fVar55;
          fVar74 = (pIVar30->Pos).y;
          local_48.Min.y = IVar56.y + fVar74;
          local_48.Max.x = IVar57.x + fVar55;
          local_48.Max.y = IVar57.y + fVar74;
          IVar56 = ScrollToBringRectIntoView(pIVar49->Window,&local_48);
        }
        else {
          fVar55 = 0.0;
          if (GImGui->NavMoveDir == 2) {
            fVar55 = (pIVar30->ScrollMax).y;
          }
          IVar56 = (ImVec2)((ulong)(uint)((pIVar30->Scroll).y - fVar55) << 0x20);
          (pIVar30->ScrollTarget).y = fVar55;
          (pIVar30->ScrollTargetCenterRatio).y = 0.0;
          (pIVar30->ScrollTargetEdgeSnapDist).y = 0.0;
        }
        fVar55 = (pIVar49->RectRel).Min.y;
        fVar74 = (pIVar49->RectRel).Max.x;
        fVar65 = (pIVar49->RectRel).Max.y;
        (pIVar49->RectRel).Min.x = (pIVar49->RectRel).Min.x - IVar56.x;
        (pIVar49->RectRel).Min.y = fVar55 - IVar56.y;
        (pIVar49->RectRel).Max.x = fVar74 - IVar56.x;
        (pIVar49->RectRel).Max.y = fVar65 - IVar56.y;
      }
      SetActiveID(0,(ImGuiWindow *)0x0);
      pIVar20->NavWindow = pIVar49->Window;
      IVar34 = pIVar49->ID;
      if (pIVar20->NavId == IVar34) {
        IVar28 = pIVar49->FocusScopeId;
      }
      else {
        pIVar20->NavJustMovedToId = IVar34;
        IVar28 = pIVar49->FocusScopeId;
        pIVar20->NavJustMovedToFocusScopeId = IVar28;
        pIVar20->NavJustMovedToKeyMods = pIVar20->NavMoveRequestKeyMods;
      }
      SetNavID(IVar34,pIVar20->NavLayer,IVar28,&pIVar49->RectRel);
      pIVar20->NavMousePosDirty = true;
      pIVar20->NavDisableHighlight = false;
    }
    pIVar20->NavDisableMouseHover = true;
  }
LAB_00141bb3:
  if (pIVar51->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
    if (pIVar51->NavMoveRequest == false) {
      __assert_fail("g.NavMoveRequest",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                    ,0x2389,"void ImGui::NavUpdate()");
    }
    if (((pIVar51->NavMoveResultLocal).ID == 0) && ((pIVar51->NavMoveResultOther).ID == 0)) {
      pIVar51->NavDisableHighlight = false;
    }
    pIVar51->NavMoveRequestForward = ImGuiNavForward_None;
  }
  if ((pIVar51->NavMousePosDirty == true) && (pIVar51->NavIdIsAlive == true)) {
    if ((((pIVar51->IO).ConfigFlags & 4) != 0) &&
       ((((((pIVar51->IO).BackendFlags & 4) != 0 && (pIVar51->NavDisableHighlight == false)) &&
         (pIVar51->NavDisableMouseHover == true)) && (pIVar51->NavWindow != (ImGuiWindow *)0x0)))) {
      IVar56 = NavCalcPreferredRefPos();
      (pIVar51->IO).MousePosPrev = IVar56;
      (pIVar51->IO).MousePos = IVar56;
      (pIVar51->IO).WantSetMousePos = true;
    }
    pIVar51->NavMousePosDirty = false;
  }
  pIVar51->NavIdIsAlive = false;
  pIVar51->NavJustTabbedId = 0;
  IVar42 = pIVar51->NavLayer;
  if (ImGuiNavLayer_Menu < IVar42) {
    __assert_fail("g.NavLayer == 0 || g.NavLayer == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x239d,"void ImGui::NavUpdate()");
  }
  pIVar30 = pIVar51->NavWindow;
  pIVar36 = pIVar30;
  if (pIVar30 != (ImGuiWindow *)0x0) {
    do {
      if ((pIVar36->RootWindow == pIVar36) || ((pIVar36->Flags & 0x14000000) != 0)) {
        if (pIVar36 != pIVar30) {
          pIVar36->NavLastChildNavWindow = pIVar30;
        }
        break;
      }
      ppIVar14 = &pIVar36->ParentWindow;
      pIVar36 = *ppIVar14;
    } while (*ppIVar14 != (ImGuiWindow *)0x0);
    if ((IVar42 == ImGuiNavLayer_Main) && (pIVar30->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      pIVar30->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar20 = GImGui;
  pIVar30 = GetTopMostPopupModal();
  if (pIVar30 != (ImGuiWindow *)0x0) {
    pIVar20->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((pIVar20->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
     (pIVar20->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar55 = (pIVar20->IO).DeltaTime * -10.0 + pIVar20->NavWindowingHighlightAlpha;
    fVar55 = (float)(-(uint)(0.0 <= fVar55) & (uint)fVar55);
    pIVar20->NavWindowingHighlightAlpha = fVar55;
    if ((pIVar20->DimBgRatio <= 0.0) && (fVar55 <= 0.0)) {
      pIVar20->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
    }
  }
  if ((pIVar30 == (ImGuiWindow *)0x0) && (pIVar20->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar55 = (pIVar20->IO).NavInputsDownDuration[3];
    if (((pIVar20->IO).KeyCtrl == true) &&
       ((iVar37 = (pIVar20->IO).KeyMap[0], -1 < iVar37 &&
        (bVar23 = IsKeyPressed(iVar37,true), bVar23)))) {
      bVar53 = (byte)(pIVar20->IO).ConfigFlags;
      IVar29 = (ImGuiInputSource)bVar53;
      if (fVar55 == 0.0 || (bVar53 & 1) != 0) {
LAB_00141dd7:
        pIVar30 = pIVar20->NavWindow;
        if ((pIVar30 != (ImGuiWindow *)0x0) ||
           (pIVar30 = FindWindowNavFocusable((pIVar20->WindowsFocusOrder).Size + -1,-0x7fffffff,-1),
           pIVar30 != (ImGuiWindow *)0x0)) {
          pIVar30 = pIVar30->RootWindow;
          pIVar20->NavWindowingTargetAnim = pIVar30;
          pIVar20->NavWindowingTarget = pIVar30;
          pIVar20->NavWindowingTimer = 0.0;
          pIVar20->NavWindowingHighlightAlpha = 0.0;
          pIVar20->NavWindowingToggleLayer = (bool)(~(byte)IVar29 & 1);
          pIVar20->NavInputSource = IVar29 & ImGuiInputSource_Mouse ^ ImGuiInputSource_Gamepad;
        }
      }
    }
    else if ((fVar55 == 0.0) && (!NAN(fVar55))) {
      IVar29 = ImGuiInputSource_None;
      goto LAB_00141dd7;
    }
  }
  fVar55 = (pIVar20->IO).DeltaTime + pIVar20->NavWindowingTimer;
  pIVar20->NavWindowingTimer = fVar55;
  if (pIVar20->NavWindowingTarget == (ImGuiWindow *)0x0) {
LAB_00142013:
    bVar23 = false;
    pIVar30 = (ImGuiWindow *)0x0;
  }
  else {
    IVar29 = pIVar20->NavInputSource;
    if (IVar29 != ImGuiInputSource_Gamepad) {
LAB_00141f7b:
      if (IVar29 == ImGuiInputSource_Keyboard) {
        fVar74 = (pIVar20->NavWindowingTimer + -0.2) / 0.05;
        fVar55 = 1.0;
        if (fVar74 <= 1.0) {
          fVar55 = fVar74;
        }
        fVar55 = (float)(~-(uint)(fVar74 < 0.0) & (uint)fVar55);
        uVar54 = -(uint)(fVar55 <= pIVar20->NavWindowingHighlightAlpha);
        pIVar20->NavWindowingHighlightAlpha =
             (float)(uVar54 & (uint)pIVar20->NavWindowingHighlightAlpha | ~uVar54 & (uint)fVar55);
        iVar37 = (GImGui->IO).KeyMap[0];
        if ((-1 < iVar37) && (bVar23 = IsKeyPressed(iVar37,true), bVar23)) {
          NavUpdateWindowingHighlightWindow((pIVar20->IO).KeyShift - 1 | 1);
        }
        if ((pIVar20->IO).KeyCtrl == false) {
          pIVar30 = pIVar20->NavWindowingTarget;
          bVar23 = false;
          goto LAB_00142018;
        }
      }
      goto LAB_00142013;
    }
    fVar74 = (fVar55 + -0.2) / 0.05;
    fVar55 = 1.0;
    if (fVar74 <= 1.0) {
      fVar55 = fVar74;
    }
    fVar55 = (float)(~-(uint)(fVar74 < 0.0) & (uint)fVar55);
    uVar54 = -(uint)(fVar55 <= pIVar20->NavWindowingHighlightAlpha);
    fVar65 = (float)(uVar54 & (uint)pIVar20->NavWindowingHighlightAlpha | ~uVar54 & (uint)fVar55);
    pIVar20->NavWindowingHighlightAlpha = fVar65;
    fVar55 = GetNavInputAmount(0xc,ImGuiInputReadMode_RepeatSlow);
    fVar74 = GetNavInputAmount(0xd,ImGuiInputReadMode_RepeatSlow);
    iVar37 = (uint)(0.0 < fVar55) - (uint)(0.0 < fVar74);
    if (iVar37 != 0) {
      NavUpdateWindowingHighlightWindow(iVar37);
      pIVar20->NavWindowingHighlightAlpha = 1.0;
      fVar65 = 1.0;
    }
    if (0.0 < (GImGui->IO).NavInputs[3]) {
      if (pIVar20->NavWindowingTarget == (ImGuiWindow *)0x0) goto LAB_00142013;
      IVar29 = pIVar20->NavInputSource;
      goto LAB_00141f7b;
    }
    pbVar50 = &pIVar20->NavWindowingToggleLayer;
    *pbVar50 = (bool)(*pbVar50 & fVar65 < 1.0);
    if (*pbVar50 == false) {
      pIVar30 = pIVar20->NavWindowingTarget;
      bVar23 = false;
    }
    else {
      bVar23 = pIVar20->NavWindow != (ImGuiWindow *)0x0;
      pIVar30 = (ImGuiWindow *)0x0;
    }
    pIVar20->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
LAB_00142018:
  pIVar21 = GImGui;
  fVar55 = (GImGui->IO).NavInputsDownDuration[0x10];
  if ((fVar55 == 0.0) && (!NAN(fVar55))) {
    pIVar20->NavWindowingToggleLayer = true;
  }
  if ((((pIVar20->ActiveId == 0) || (pIVar20->ActiveIdAllowOverlap == true)) && (fVar55 < 0.0)) &&
     ((pIVar20->NavWindowingToggleLayer != false &&
      (0.0 <= (pIVar21->IO).NavInputsDownDurationPrev[0x10])))) {
    bVar24 = IsMousePosValid(&(pIVar20->IO).MousePos);
    bVar25 = IsMousePosValid(&(pIVar20->IO).MousePosPrev);
    bVar23 = (bool)(bVar25 == bVar24 | bVar23);
  }
  pIVar36 = pIVar20->NavWindowingTarget;
  if ((pIVar36 != (ImGuiWindow *)0x0) && ((pIVar36->Flags & 4) == 0)) {
    if (pIVar20->NavInputSource == ImGuiInputSource_Gamepad) {
      dir_sources = 4;
LAB_0014210f:
      IVar56 = GetNavInputAmount2d(dir_sources,ImGuiInputReadMode_Down,0.0,0.0);
    }
    else {
      IVar56.x = 0.0;
      IVar56.y = 0.0;
      if ((pIVar20->NavInputSource == ImGuiInputSource_Keyboard) &&
         (dir_sources = 1, (pIVar20->IO).KeyShift == false)) goto LAB_0014210f;
    }
    fVar55 = IVar56.y;
    if (((IVar56.x != 0.0) || (fVar55 != 0.0)) || (NAN(fVar55))) {
      fVar74 = (pIVar20->IO).DisplayFramebufferScale.x;
      fVar65 = (pIVar20->IO).DisplayFramebufferScale.y;
      if (fVar65 <= fVar74) {
        fVar74 = fVar65;
      }
      fVar74 = (float)(int)(fVar74 * (pIVar20->IO).DeltaTime * 800.0);
      pIVar36 = pIVar36->RootWindow;
      local_48.Min.x = (pIVar36->Pos).x + IVar56.x * fVar74;
      local_48.Min.y = (pIVar36->Pos).y + fVar55 * fVar74;
      SetWindowPos(pIVar36,&local_48.Min,1);
      if (((pIVar36->Flags & 0x100) == 0) && (GImGui->SettingsDirtyTimer <= 0.0)) {
        GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
      }
      pIVar20->NavDisableMouseHover = true;
    }
  }
  if (pIVar30 != (ImGuiWindow *)0x0) {
    if ((pIVar20->NavWindow == (ImGuiWindow *)0x0) || (pIVar30 != pIVar20->NavWindow->RootWindow)) {
      SetActiveID(0,(ImGuiWindow *)0x0);
      pIVar20->NavDisableHighlight = false;
      pIVar20->NavDisableMouseHover = true;
      pIVar36 = pIVar30->NavLastChildNavWindow;
      if ((pIVar36 == (ImGuiWindow *)0x0) || (pIVar36->WasActive == false)) {
        pIVar36 = pIVar30;
      }
      ClosePopupsOverWindow(pIVar36,false);
      FocusWindow(pIVar36);
      if (pIVar36->NavLastIds[0] == 0) {
        NavInitWindow(pIVar36,false);
      }
      if ((pIVar36->DC).NavLayersActiveMaskNext == 2) {
        pIVar20->NavLayer = ImGuiNavLayer_Menu;
      }
    }
    pIVar20->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((bVar23) && (pIVar20->NavWindow != (ImGuiWindow *)0x0)) {
    SetActiveID(0,(ImGuiWindow *)0x0);
    pIVar30 = pIVar20->NavWindow;
    pIVar36 = pIVar30;
    do {
      window_00 = pIVar36;
      if ((window_00->ParentWindow == (ImGuiWindow *)0x0) ||
         (((window_00->DC).NavLayersActiveMask & 2) != 0)) break;
      pIVar36 = window_00->ParentWindow;
    } while ((window_00->Flags & 0x15000000U) == 0x1000000);
    if (window_00 != pIVar30) {
      FocusWindow(window_00);
      window_00->NavLastChildNavWindow = pIVar30;
      pIVar30 = pIVar20->NavWindow;
    }
    pIVar20->NavDisableHighlight = false;
    pIVar20->NavDisableMouseHover = true;
    IVar42 = ImGuiNavLayer_Main;
    if (((pIVar30->DC).NavLayersActiveMask & 2) != 0) {
      if (pIVar20->NavLayer == ImGuiNavLayer_Main) {
        pIVar30->NavLastIds[1] = 0;
        IVar42 = ImGuiNavLayer_Menu;
      }
      else {
        IVar42 = pIVar20->NavLayer ^ ImGuiNavLayer_Menu;
      }
    }
    NavRestoreLayer(IVar42);
  }
  if (((bool)((uVar27 & 1) == 0 & (bVar18 ^ 1))) || (pIVar51->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar51->IO).NavActive = false;
LAB_001423a2:
    bVar23 = pIVar51->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  else {
    bVar23 = (pIVar51->NavWindow->Flags & 0x40000U) == 0;
    (pIVar51->IO).NavActive = bVar23;
    if (((!bVar23) || (pIVar51->NavId == 0)) ||
       (bVar23 = true, pIVar51->NavDisableHighlight != false)) goto LAB_001423a2;
  }
  (pIVar51->IO).NavVisible = bVar23;
  fVar55 = (GImGui->IO).NavInputsDownDuration[1];
  if ((fVar55 == 0.0) && (!NAN(fVar55))) {
    if (pIVar51->ActiveId == 0) {
      if (pIVar51->NavLayer == ImGuiNavLayer_Main) {
        pIVar30 = pIVar51->NavWindow;
        if (pIVar30 == (ImGuiWindow *)0x0) {
          uVar54 = (pIVar51->OpenPopupStack).Size;
          if ((int)uVar54 < 1) goto LAB_001429d1;
LAB_001429a0:
          if ((((pIVar51->OpenPopupStack).Data[(ulong)uVar54 - 1].Window)->Flags & 0x8000000) == 0)
          {
            ClosePopupToLevel(uVar54 - 1,true);
          }
        }
        else if (((pIVar30 == pIVar30->RootWindow) || ((pIVar30->Flags & 0x4000000) != 0)) ||
                (pIVar36 = pIVar30->ParentWindow, pIVar36 == (ImGuiWindow *)0x0)) {
          uVar54 = (pIVar51->OpenPopupStack).Size;
          if (0 < (int)uVar54) goto LAB_001429a0;
          if ((pIVar30->Flags & 0x5000000U) != 0x1000000) {
            pIVar30->NavLastIds[0] = 0;
          }
LAB_001429d1:
          pIVar51->NavId = 0;
          pIVar51->NavFocusScopeId = 0;
        }
        else {
          if (pIVar30->ChildId == 0) {
            __assert_fail("child_window->ChildId != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                          ,0x23bf,"void ImGui::NavUpdate()");
          }
          IVar56 = pIVar30->Size;
          fVar65 = (pIVar30->Pos).x;
          fVar71 = (pIVar30->Pos).y;
          FocusWindow(pIVar36);
          fVar55 = (pIVar36->Pos).x;
          local_48.Min.x = fVar65 - fVar55;
          fVar74 = (pIVar36->Pos).y;
          local_48.Min.y = fVar71 - fVar74;
          local_48.Max.x = (IVar56.x + fVar65) - fVar55;
          local_48.Max.y = (IVar56.y + fVar71) - fVar74;
          SetNavID(pIVar30->ChildId,ImGuiNavLayer_Main,0,&local_48);
        }
      }
      else {
        NavRestoreLayer(ImGuiNavLayer_Main);
      }
    }
    else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
      SetActiveID(0,(ImGuiWindow *)0x0);
    }
  }
  pIVar51->NavActivateId = 0;
  pIVar51->NavActivateDownId = 0;
  pIVar51->NavActivatePressedId = 0;
  pIVar20 = GImGui;
  pIVar51->NavInputId = 0;
  IVar34 = pIVar51->NavId;
  IVar28 = 0;
  if ((IVar34 == 0) || (pIVar51->NavDisableHighlight != false)) {
    IVar40 = 0;
LAB_00142439:
    pIVar30 = pIVar51->NavWindow;
    bVar23 = pIVar30 == (ImGuiWindow *)0x0;
    if ((!bVar23) && ((pIVar30->Flags & 0x40000) != 0)) {
      pIVar51->NavDisableHighlight = true;
    }
    if (IVar28 != IVar40 && IVar40 != 0) {
      __assert_fail("g.NavActivateDownId == g.NavActivateId",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                    ,0x23e5,"void ImGui::NavUpdate()");
    }
  }
  else {
    IVar40 = 0;
    if (pIVar51->NavWindowingTarget != (ImGuiWindow *)0x0) goto LAB_00142439;
    IVar28 = 0;
    if (pIVar51->NavWindow != (ImGuiWindow *)0x0) {
      if ((pIVar51->NavWindow->Flags & 0x40000) == 0) {
        if (0.0 < (GImGui->IO).NavInputs[0]) {
          fVar55 = (GImGui->IO).NavInputsDownDuration[0];
          IVar22 = IVar34;
          if (0.0 <= fVar55) {
            IVar43 = pIVar51->ActiveId;
            if (IVar43 == 0 && fVar55 == 0.0) {
              pIVar51->NavActivateId = IVar34;
              pIVar51->NavActivateDownId = IVar34;
              IVar40 = IVar34;
            }
            else {
              if (IVar43 == 0) {
                pIVar51->NavActivateDownId = IVar34;
              }
              else {
                if (IVar43 != IVar34) goto LAB_001428be;
                pIVar51->NavActivateDownId = IVar34;
              }
              IVar40 = 0;
              if ((fVar55 != 0.0) || (IVar40 = 0, NAN(fVar55))) goto LAB_00143d5d;
            }
            pIVar51->NavActivatePressedId = IVar34;
          }
          else {
            IVar43 = pIVar51->ActiveId;
            if ((IVar43 != 0) && (IVar43 != IVar34)) goto LAB_001428be;
            pIVar51->NavActivateDownId = IVar34;
            IVar40 = 0;
          }
        }
        else {
          IVar43 = pIVar51->ActiveId;
          if (IVar43 == 0) {
            IVar40 = 0;
            IVar22 = 0;
          }
          else {
LAB_001428be:
            IVar28 = 0;
            IVar40 = 0;
            IVar22 = 0;
            if (IVar43 != IVar34) goto LAB_00142439;
          }
        }
LAB_00143d5d:
        IVar28 = IVar22;
        fVar55 = (pIVar20->IO).NavInputsDownDuration[2];
        if ((fVar55 == 0.0) && (!NAN(fVar55))) {
          pIVar51->NavInputId = IVar34;
        }
      }
      goto LAB_00142439;
    }
    bVar23 = true;
    pIVar30 = (ImGuiWindow *)0x0;
  }
  pIVar51->NavMoveRequest = false;
  IVar34 = pIVar51->NavNextActivateId;
  if (IVar34 != 0) {
    pIVar51->NavActivateId = IVar34;
    pIVar51->NavActivateDownId = IVar34;
    pIVar51->NavActivatePressedId = IVar34;
    pIVar51->NavInputId = IVar34;
  }
  pIVar51->NavNextActivateId = 0;
  if (pIVar51->NavMoveRequestForward == ImGuiNavForward_None) {
    pIVar51->NavMoveDir = -1;
    pIVar51->NavMoveRequestFlags = 0;
    IVar38 = -1;
    if (((!bVar23) && (pIVar51->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar30->Flags & 0x40000) == 0)) {
      uVar54 = GImGui->ActiveIdUsingNavDirMask;
      IVar38 = -1;
      if (((uVar54 & 1) == 0) &&
         ((fVar55 = GetNavInputAmount(4,ImGuiInputReadMode_Repeat), 0.0 < fVar55 ||
          (fVar55 = GetNavInputAmount(0x11,ImGuiInputReadMode_Repeat), 0.0 < fVar55)))) {
        pIVar51->NavMoveDir = 0;
        IVar38 = 0;
      }
      if (((uVar54 & 2) == 0) &&
         ((fVar55 = GetNavInputAmount(5,ImGuiInputReadMode_Repeat), 0.0 < fVar55 ||
          (fVar55 = GetNavInputAmount(0x12,ImGuiInputReadMode_Repeat), 0.0 < fVar55)))) {
        pIVar51->NavMoveDir = 1;
        IVar38 = 1;
      }
      if (((uVar54 & 4) == 0) &&
         ((fVar55 = GetNavInputAmount(6,ImGuiInputReadMode_Repeat), 0.0 < fVar55 ||
          (fVar55 = GetNavInputAmount(0x13,ImGuiInputReadMode_Repeat), 0.0 < fVar55)))) {
        pIVar51->NavMoveDir = 2;
        IVar38 = 2;
      }
      if (((uVar54 & 8) == 0) &&
         ((fVar55 = GetNavInputAmount(7,ImGuiInputReadMode_Repeat), 0.0 < fVar55 ||
          (fVar55 = GetNavInputAmount(0x14,ImGuiInputReadMode_Repeat), 0.0 < fVar55)))) {
        pIVar51->NavMoveDir = 3;
        IVar38 = 3;
      }
    }
    pIVar51->NavMoveClipDir = IVar38;
  }
  else {
    if ((pIVar51->NavMoveDir == -1) || (pIVar51->NavMoveClipDir == -1)) {
      __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                    ,0x2400,"void ImGui::NavUpdate()");
    }
    if (pIVar51->NavMoveRequestForward != ImGuiNavForward_ForwardQueued) {
      __assert_fail("g.NavMoveRequestForward == ImGuiNavForward_ForwardQueued",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                    ,0x2401,"void ImGui::NavUpdate()");
    }
    pIVar51->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
  }
  pIVar20 = GImGui;
  fVar55 = 0.0;
  if ((((((uVar27 & 1) != 0) && (GImGui->NavMoveDir == -1)) &&
       (pIVar30 = GImGui->NavWindow, pIVar30 != (ImGuiWindow *)0x0)) &&
      (((pIVar30->Flags & 0x40000) == 0 && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)))) &&
     (GImGui->NavLayer == ImGuiNavLayer_Main)) {
    bVar23 = IsKeyDown((GImGui->IO).KeyMap[5]);
    bVar24 = false;
    bVar25 = false;
    if (bVar23) {
      bVar25 = (GImGui->ActiveIdUsingKeyInputMask & 0x20) == 0;
    }
    bVar23 = IsKeyDown((pIVar20->IO).KeyMap[6]);
    if (bVar23) {
      bVar24 = (GImGui->ActiveIdUsingKeyInputMask & 0x40) == 0;
    }
    bVar23 = IsKeyPressed((pIVar20->IO).KeyMap[7],true);
    if (bVar23) {
      bVar23 = (GImGui->ActiveIdUsingKeyInputMask & 0x80) == 0;
    }
    else {
      bVar23 = false;
    }
    bVar26 = IsKeyPressed((pIVar20->IO).KeyMap[8],true);
    if (bVar26) {
      bVar26 = (GImGui->ActiveIdUsingKeyInputMask & 0x100) == 0;
    }
    else {
      bVar26 = false;
    }
    fVar55 = 0.0;
    if ((bVar25 != bVar24) || (bVar23 != bVar26)) {
      if (((pIVar30->DC).NavLayersActiveMask == 0) && ((pIVar30->DC).NavHasScroll == true)) {
        bVar24 = IsKeyPressed((pIVar20->IO).KeyMap[5],true);
        if (bVar24) {
          fVar55 = (pIVar30->Scroll).y - ((pIVar30->InnerRect).Max.y - (pIVar30->InnerRect).Min.y);
LAB_0014400b:
          (pIVar30->ScrollTarget).y = fVar55;
        }
        else {
          bVar24 = IsKeyPressed((pIVar20->IO).KeyMap[6],true);
          if (bVar24) {
            fVar55 = ((pIVar30->InnerRect).Max.y - (pIVar30->InnerRect).Min.y) + (pIVar30->Scroll).y
            ;
            goto LAB_0014400b;
          }
          if (bVar23 == false) {
            if (bVar26 == false) goto LAB_0014401e;
            fVar55 = (pIVar30->ScrollMax).y;
            goto LAB_0014400b;
          }
          (pIVar30->ScrollTarget).y = 0.0;
        }
        (pIVar30->ScrollTargetCenterRatio).y = 0.0;
        (pIVar30->ScrollTargetEdgeSnapDist).y = 0.0;
LAB_0014401e:
        fVar55 = 0.0;
      }
      else {
        IVar42 = pIVar20->NavLayer;
        pIVar39 = pIVar30->NavRectRel + IVar42;
        fVar55 = GImGui->FontBaseSize * pIVar30->FontWindowScale;
        if (pIVar30->ParentWindow != (ImGuiWindow *)0x0) {
          fVar55 = fVar55 * pIVar30->ParentWindow->FontWindowScale;
        }
        fVar55 = (pIVar30->NavRectRel[IVar42].Max.y - pIVar30->NavRectRel[IVar42].Min.y) +
                 (((pIVar30->InnerRect).Max.y - (pIVar30->InnerRect).Min.y) - fVar55);
        fVar55 = (float)(~-(uint)(fVar55 <= 0.0) & (uint)fVar55);
        bVar24 = IsKeyPressed((pIVar20->IO).KeyMap[5],true);
        if (bVar24) {
          fVar55 = -fVar55;
          pIVar20->NavMoveDir = 3;
          pIVar20->NavMoveClipDir = 2;
          pIVar20->NavMoveRequestFlags = 0x30;
        }
        else {
          bVar24 = IsKeyPressed((pIVar20->IO).KeyMap[6],true);
          if (!bVar24) {
            if (bVar23 == false) {
              fVar55 = 0.0;
              if (bVar26 != false) {
                fVar74 = ((pIVar30->ScrollMax).y + (pIVar30->SizeFull).y) - (pIVar30->Scroll).y;
                pIVar30->NavRectRel[IVar42].Max.y = fVar74;
                pIVar30->NavRectRel[IVar42].Min.y = fVar74;
                fVar74 = (pIVar39->Min).x;
                pIVar2 = &pIVar30->NavRectRel[IVar42].Max;
                if (pIVar2->x <= fVar74 && fVar74 != pIVar2->x) {
                  pIVar30->NavRectRel[IVar42].Max.x = 0.0;
                  (pIVar39->Min).x = 0.0;
                }
                pIVar20->NavMoveDir = 2;
                pIVar20->NavMoveRequestFlags = 0x50;
              }
              goto LAB_00142659;
            }
            fVar55 = -(pIVar30->Scroll).y;
            pIVar30->NavRectRel[IVar42].Max.y = fVar55;
            pIVar30->NavRectRel[IVar42].Min.y = fVar55;
            fVar55 = (pIVar39->Min).x;
            pIVar2 = &pIVar30->NavRectRel[IVar42].Max;
            if (pIVar2->x <= fVar55 && fVar55 != pIVar2->x) {
              pIVar30->NavRectRel[IVar42].Max.x = 0.0;
              (pIVar39->Min).x = 0.0;
            }
            pIVar20->NavMoveDir = 3;
            pIVar20->NavMoveRequestFlags = 0x50;
            goto LAB_0014401e;
          }
          pIVar20->NavMoveDir = 2;
          pIVar20->NavMoveClipDir = 3;
          pIVar20->NavMoveRequestFlags = 0x30;
        }
      }
    }
  }
LAB_00142659:
  uVar27 = pIVar51->NavMoveDir;
  if (uVar27 == 0xffffffff) {
    bVar53 = pIVar51->NavMoveRequest;
    if ((bVar53 & 1) != 0) goto LAB_00142696;
    bVar23 = false;
  }
  else {
    pIVar51->NavMoveRequest = true;
    pIVar51->NavMoveRequestKeyMods = (pIVar51->IO).KeyMods;
    pIVar51->NavMoveDirLast = uVar27;
    bVar53 = 1;
LAB_00142696:
    bVar23 = true;
    if (pIVar51->NavId == 0) {
      pIVar51->NavInitRequest = true;
      pIVar51->NavInitRequestFromMove = true;
      pIVar51->NavInitResultId = 0;
      pIVar51->NavDisableHighlight = false;
    }
  }
  pIVar20 = GImGui;
  if (GImGui->NavMoveRequest == false) {
    pbVar50 = &GImGui->NavInitRequest;
    GImGui->NavAnyRequest = *pbVar50;
    if (*pbVar50 != false) goto LAB_001427b0;
  }
  else {
    GImGui->NavAnyRequest = true;
LAB_001427b0:
    if (pIVar20->NavWindow == (ImGuiWindow *)0x0) {
      __assert_fail("g.NavWindow != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                    ,0x22e7,"void ImGui::NavUpdateAnyRequestFlag()");
    }
  }
  pIVar30 = pIVar51->NavWindow;
  if (((pIVar30 != (ImGuiWindow *)0x0) && ((pIVar30->Flags & 0x40000) == 0)) &&
     (pIVar51->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar74 = pIVar20->FontBaseSize * pIVar30->FontWindowScale;
    if (pIVar30->ParentWindow != (ImGuiWindow *)0x0) {
      fVar74 = fVar74 * pIVar30->ParentWindow->FontWindowScale;
    }
    fVar74 = (float)(int)(fVar74 * 100.0 * (pIVar51->IO).DeltaTime + 0.5);
    if (((pIVar30->DC).NavLayersActiveMask == 0) && ((bVar53 & (pIVar30->DC).NavHasScroll) == 1)) {
      if (uVar27 < 2) {
        lVar48 = 0x7c;
        lVar52 = 0x74;
        lVar45 = 0x6c;
        lVar46 = 0x5c;
        uVar54 = 0;
      }
      else {
        if ((uVar27 & 0xfffffffe) != 2) goto LAB_00142a6e;
        lVar48 = 0x80;
        lVar52 = 0x78;
        lVar45 = 0x70;
        uVar54 = 2;
        lVar46 = 0x60;
      }
      *(float *)((long)&pIVar30->Name + lVar45) =
           (float)(int)(*(float *)(&DAT_0036d514 + (ulong)(uVar27 == uVar54) * 4) * fVar74 +
                       *(float *)((long)&pIVar30->Name + lVar46));
      *(undefined4 *)((long)&pIVar30->Name + lVar52) = 0;
      *(undefined4 *)((long)&pIVar30->Name + lVar48) = 0;
    }
LAB_00142a6e:
    IVar56 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    fVar65 = IVar56.x;
    fVar71 = IVar56.y;
    if (((fVar65 != 0.0) || (NAN(fVar65))) && (pIVar30->ScrollbarX == true)) {
      (pIVar30->ScrollTarget).x = (float)(int)(fVar65 * fVar74 + (pIVar30->Scroll).x);
      (pIVar30->ScrollTargetCenterRatio).x = 0.0;
      (pIVar30->ScrollTargetEdgeSnapDist).x = 0.0;
    }
    if ((fVar71 != 0.0) || (NAN(fVar71))) {
      (pIVar30->ScrollTarget).y = (float)(int)(fVar71 * fVar74 + (pIVar30->Scroll).y);
      (pIVar30->ScrollTargetCenterRatio).y = 0.0;
      (pIVar30->ScrollTargetEdgeSnapDist).y = 0.0;
    }
  }
  (pIVar51->NavMoveResultLocal).RectRel.Min.x = 0.0;
  (pIVar51->NavMoveResultLocal).RectRel.Min.y = 0.0;
  (pIVar51->NavMoveResultLocal).RectRel.Max.x = 0.0;
  (pIVar51->NavMoveResultLocal).RectRel.Max.y = 0.0;
  (pIVar51->NavMoveResultLocal).Window = (ImGuiWindow *)0x0;
  (pIVar51->NavMoveResultLocal).ID = 0;
  (pIVar51->NavMoveResultLocal).FocusScopeId = 0;
  (pIVar51->NavMoveResultLocal).DistAxial = 3.4028235e+38;
  (pIVar51->NavMoveResultLocal).DistBox = 3.4028235e+38;
  (pIVar51->NavMoveResultLocal).DistCenter = 3.4028235e+38;
  (pIVar51->NavMoveResultLocalVisibleSet).Window = (ImGuiWindow *)0x0;
  (pIVar51->NavMoveResultLocalVisibleSet).ID = 0;
  (pIVar51->NavMoveResultLocalVisibleSet).FocusScopeId = 0;
  (pIVar51->NavMoveResultLocalVisibleSet).RectRel.Min.x = 0.0;
  (pIVar51->NavMoveResultLocalVisibleSet).RectRel.Min.y = 0.0;
  (pIVar51->NavMoveResultLocalVisibleSet).RectRel.Max.x = 0.0;
  (pIVar51->NavMoveResultLocalVisibleSet).RectRel.Max.y = 0.0;
  (pIVar51->NavMoveResultLocalVisibleSet).DistAxial = 3.4028235e+38;
  (pIVar51->NavMoveResultLocalVisibleSet).DistBox = 3.4028235e+38;
  (pIVar51->NavMoveResultLocalVisibleSet).DistCenter = 3.4028235e+38;
  (pIVar51->NavMoveResultOther).Window = (ImGuiWindow *)0x0;
  (pIVar51->NavMoveResultOther).ID = 0;
  (pIVar51->NavMoveResultOther).FocusScopeId = 0;
  (pIVar51->NavMoveResultOther).RectRel.Min.x = 0.0;
  (pIVar51->NavMoveResultOther).RectRel.Min.y = 0.0;
  (pIVar51->NavMoveResultOther).RectRel.Max.x = 0.0;
  (pIVar51->NavMoveResultOther).RectRel.Max.y = 0.0;
  (pIVar51->NavMoveResultOther).DistAxial = 3.4028235e+38;
  (pIVar51->NavMoveResultOther).DistBox = 3.4028235e+38;
  (pIVar51->NavMoveResultOther).DistCenter = 3.4028235e+38;
  if (((bVar23) && (pIVar51->NavInputSource == ImGuiInputSource_Gamepad)) &&
     (pIVar51->NavLayer == ImGuiNavLayer_Main)) {
    fVar74 = (pIVar30->Pos).x;
    fVar65 = (pIVar30->Pos).y;
    auVar73._0_4_ = ((pIVar30->InnerRect).Min.x - fVar74) + -1.0;
    auVar73._4_4_ = ((pIVar30->InnerRect).Min.y - fVar65) + -1.0;
    auVar73._8_4_ = ((pIVar30->InnerRect).Max.x - fVar74) + 1.0;
    auVar73._12_4_ = ((pIVar30->InnerRect).Max.y - fVar65) + 1.0;
    if (((pIVar30->NavRectRel[0].Min.x < auVar73._0_4_) ||
        (pIVar30->NavRectRel[0].Min.y < auVar73._4_4_)) ||
       ((auVar73._8_4_ < pIVar30->NavRectRel[0].Max.x ||
        (auVar73._12_4_ < pIVar30->NavRectRel[0].Max.y)))) {
      fVar74 = pIVar20->FontBaseSize * pIVar30->FontWindowScale;
      if (pIVar30->ParentWindow != (ImGuiWindow *)0x0) {
        fVar74 = fVar74 * pIVar30->ParentWindow->FontWindowScale;
      }
      auVar68._0_4_ = fVar74 * 0.5;
      auVar66._0_4_ = auVar73._8_4_ - auVar73._0_4_;
      auVar66._4_4_ = auVar73._12_4_ - auVar73._4_4_;
      auVar66._8_4_ = auVar73._8_4_ - auVar73._8_4_;
      auVar66._12_4_ = auVar73._12_4_ - auVar73._12_4_;
      auVar68._4_4_ = auVar68._0_4_;
      auVar68._8_4_ = auVar68._0_4_;
      auVar68._12_4_ = auVar68._0_4_;
      auVar66 = minps(auVar66,auVar68);
      local_48.Min.x = auVar66._0_4_ + auVar73._0_4_;
      local_48.Min.y = auVar66._4_4_ + auVar73._4_4_;
      auVar17._4_8_ = auVar73._8_8_;
      auVar17._0_4_ = auVar73._4_4_ - auVar68._0_4_;
      auVar61._0_8_ = auVar17._0_8_ << 0x20;
      auVar61._8_4_ = auVar73._8_4_ - auVar66._0_4_;
      auVar61._12_4_ = auVar73._12_4_ - auVar66._4_4_;
      local_48.Max = auVar61._8_8_;
      ImRect::ClipWithFull(pIVar30->NavRectRel,&local_48);
      pIVar51->NavId = 0;
      pIVar51->NavFocusScopeId = 0;
      pIVar30 = pIVar51->NavWindow;
    }
  }
  if (pIVar30 == (ImGuiWindow *)0x0) {
    fVar65 = 1.0;
    fVar67 = 0.0;
    fVar74 = 0.0;
    fVar71 = 0.0;
  }
  else {
    IVar42 = pIVar51->NavLayer;
    fVar65 = pIVar30->NavRectRel[IVar42].Min.x;
    fVar63 = pIVar30->NavRectRel[IVar42].Max.x;
    fVar74 = 0.0;
    if (fVar63 < fVar65) {
      fVar71 = 0.0;
      fVar64 = 0.0;
      fVar67 = 0.0;
    }
    else {
      fVar7 = pIVar30->NavRectRel[IVar42].Min.y;
      fVar8 = pIVar30->NavRectRel[IVar42].Max.y;
      fVar64 = 0.0;
      fVar71 = 0.0;
      fVar67 = 0.0;
      if (fVar7 <= fVar8) {
        fVar74 = fVar8;
        fVar64 = fVar65;
        fVar71 = fVar63;
        fVar67 = fVar7;
      }
    }
    fVar65 = (pIVar30->Pos).x;
    fVar63 = (pIVar30->Pos).y;
    fVar67 = fVar67 + fVar63;
    fVar71 = fVar71 + fVar65;
    fVar74 = fVar74 + fVar63;
    fVar65 = fVar64 + fVar65 + 1.0;
  }
  if (fVar71 <= fVar65) {
    fVar65 = fVar71;
  }
  (pIVar51->NavScoringRect).Min.y = fVar67 + fVar55;
  (pIVar51->NavScoringRect).Max.y = fVar74 + fVar55;
  (pIVar51->NavScoringRect).Min.x = fVar65;
  (pIVar51->NavScoringRect).Max.x = fVar65;
  if (fVar74 + fVar55 < fVar67 + fVar55) {
    __assert_fail("!g.NavScoringRect.IsInverted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x2450,"void ImGui::NavUpdate()");
  }
  pIVar51->NavScoringCount = 0;
  pIVar51 = GImGui;
  pIVar2 = &(GImGui->IO).MousePos;
  bVar23 = IsMousePosValid(pIVar2);
  if (bVar23) {
    IVar56 = (pIVar51->IO).MousePos;
    IVar57.x = (float)(int)IVar56.x;
    IVar57.y = (float)(int)IVar56.y;
    pIVar51->LastValidMousePos = IVar57;
    (pIVar51->IO).MousePos = IVar57;
  }
  bVar23 = IsMousePosValid(pIVar2);
  if ((bVar23) && (bVar23 = IsMousePosValid(&(pIVar51->IO).MousePosPrev), bVar23)) {
    IVar56 = (pIVar51->IO).MousePos;
    IVar57 = (pIVar51->IO).MousePosPrev;
    IVar58.x = IVar56.x - IVar57.x;
    IVar58.y = IVar56.y - IVar57.y;
    (pIVar51->IO).MouseDelta = IVar58;
    if ((((IVar58.x != 0.0) || (NAN(IVar58.x))) || (IVar58.y != 0.0)) || (NAN(IVar58.y))) {
      pIVar51->NavDisableMouseHover = false;
    }
  }
  else {
    (pIVar51->IO).MouseDelta.x = 0.0;
    (pIVar51->IO).MouseDelta.y = 0.0;
  }
  (pIVar51->IO).MousePosPrev = (pIVar51->IO).MousePos;
  lVar48 = 0;
  do {
    if ((pIVar51->IO).MouseDown[lVar48] == true) {
      fVar55 = (pIVar51->IO).MouseDownDuration[lVar48];
      pbVar50 = (pIVar51->IO).MouseClicked + lVar48;
      *pbVar50 = fVar55 < 0.0;
      pbVar50[10] = false;
      (pIVar51->IO).MouseDownDurationPrev[lVar48] = fVar55;
      if (0.0 <= fVar55) {
        (pIVar51->IO).MouseDownDuration[lVar48] = fVar55 + (pIVar51->IO).DeltaTime;
        (pIVar51->IO).MouseDoubleClicked[lVar48] = false;
        bVar23 = IsMousePosValid(pIVar2);
        auVar62 = ZEXT816(0);
        if (bVar23) {
          IVar56 = (pIVar51->IO).MousePos;
          IVar57 = (pIVar51->IO).MouseClickedPos[lVar48];
          auVar62._0_4_ = IVar56.x - IVar57.x;
          auVar62._4_4_ = IVar56.y - IVar57.y;
          auVar62._8_8_ = 0;
        }
        fVar55 = (pIVar51->IO).MouseDragMaxDistanceSqr[lVar48];
        fVar74 = auVar62._0_4_ * auVar62._0_4_ + auVar62._4_4_ * auVar62._4_4_;
        uVar27 = -(uint)(fVar74 <= fVar55);
        (pIVar51->IO).MouseDragMaxDistanceSqr[lVar48] =
             (float)(~uVar27 & (uint)fVar74 | (uint)fVar55 & uVar27);
        IVar56 = (pIVar51->IO).MouseDragMaxDistanceAbs[lVar48];
        auVar69._0_8_ = auVar62._0_8_ ^ 0x8000000080000000;
        auVar69._8_4_ = auVar62._8_4_ ^ 0x80000000;
        auVar69._12_4_ = auVar62._12_4_ ^ 0x80000000;
        auVar73 = maxps(auVar69,auVar62);
        fVar55 = IVar56.x;
        fVar74 = IVar56.y;
        uVar27 = -(uint)(auVar73._0_4_ <= fVar55);
        uVar54 = -(uint)(auVar73._4_4_ <= fVar74);
        pIVar6 = (pIVar51->IO).MouseDragMaxDistanceAbs + lVar48;
        pIVar6->x = (float)(~uVar27 & (uint)auVar73._0_4_ | (uint)fVar55 & uVar27);
        pIVar6->y = (float)(~uVar54 & (uint)auVar73._4_4_ | (uint)fVar74 & uVar54);
      }
      else {
        (pIVar51->IO).MouseDownDuration[lVar48] = 0.0;
        (pIVar51->IO).MouseDoubleClicked[lVar48] = false;
        dVar59 = pIVar51->Time;
        if ((float)(dVar59 - (pIVar51->IO).MouseClickedTime[lVar48]) <
            (pIVar51->IO).MouseDoubleClickTime) {
          bVar23 = IsMousePosValid(pIVar2);
          fVar55 = 0.0;
          fVar74 = 0.0;
          if (bVar23) {
            IVar56 = (pIVar51->IO).MousePos;
            IVar57 = (pIVar51->IO).MouseClickedPos[lVar48];
            fVar55 = IVar56.x - IVar57.x;
            fVar74 = IVar56.y - IVar57.y;
          }
          fVar65 = (pIVar51->IO).MouseDoubleClickMaxDist;
          if (fVar55 * fVar55 + fVar74 * fVar74 < fVar65 * fVar65) {
            (pIVar51->IO).MouseDoubleClicked[lVar48] = true;
          }
          dVar59 = (double)((pIVar51->IO).MouseDoubleClickTime * -2.0);
        }
        (pIVar51->IO).MouseClickedTime[lVar48] = dVar59;
        (pIVar51->IO).MouseClickedPos[lVar48] = (pIVar51->IO).MousePos;
        (pIVar51->IO).MouseDownWasDoubleClick[lVar48] = (pIVar51->IO).MouseDoubleClicked[lVar48];
        pIVar6 = (pIVar51->IO).MouseDragMaxDistanceAbs + lVar48;
        pIVar6->x = 0.0;
        pIVar6->y = 0.0;
        (pIVar51->IO).MouseDragMaxDistanceSqr[lVar48] = 0.0;
      }
    }
    else {
      (pIVar51->IO).MouseClicked[lVar48] = false;
      fVar55 = (pIVar51->IO).MouseDownDuration[lVar48];
      (pIVar51->IO).MouseReleased[lVar48] = 0.0 <= fVar55;
      pbVar50 = (pIVar51->IO).MouseClicked + lVar48;
      (pIVar51->IO).MouseDownDurationPrev[lVar48] = fVar55;
      (pIVar51->IO).MouseDownDuration[lVar48] = -1.0;
      (pIVar51->IO).MouseDoubleClicked[lVar48] = false;
    }
    if (((pIVar51->IO).MouseDown[lVar48] == false) && ((pIVar51->IO).MouseReleased[lVar48] == false)
       ) {
      (pIVar51->IO).MouseDownWasDoubleClick[lVar48] = false;
    }
    if (*pbVar50 == true) {
      pIVar51->NavDisableMouseHover = false;
    }
    lVar48 = lVar48 + 1;
  } while (lVar48 != 5);
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar30 = GetTopMostPopupModal();
  if ((pIVar30 != (ImGuiWindow *)0x0) ||
     ((pIVar19->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < pIVar19->NavWindowingHighlightAlpha)))) {
    fVar55 = (pIVar19->IO).DeltaTime * 6.0 + pIVar19->DimBgRatio;
    if (1.0 <= fVar55) {
      fVar55 = 1.0;
    }
    pIVar19->DimBgRatio = fVar55;
  }
  else {
    fVar55 = (pIVar19->IO).DeltaTime * -10.0 + pIVar19->DimBgRatio;
    pIVar19->DimBgRatio = (float)(-(uint)(0.0 <= fVar55) & (uint)fVar55);
  }
  pIVar19->MouseCursor = 0;
  pIVar19->WantTextInputNextFrame = -1;
  pIVar19->WantCaptureMouseNextFrame = -1;
  pIVar19->WantCaptureKeyboardNextFrame = -1;
  (pIVar19->PlatformImePos).x = 1.0;
  pIVar51 = GImGui;
  (pIVar19->PlatformImePos).y = 1.0;
  if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
    GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    bVar23 = IsMousePosValid((ImVec2 *)0x0);
    if (((bVar23) &&
        (fVar55 = (pIVar51->IO).MouseDragThreshold,
        fVar74 = (pIVar51->IO).MousePos.x - (pIVar51->WheelingWindowRefMousePos).x,
        fVar65 = (pIVar51->IO).MousePos.y - (pIVar51->WheelingWindowRefMousePos).y,
        fVar55 * fVar55 < fVar74 * fVar74 + fVar65 * fVar65)) ||
       (pIVar51->WheelingWindowTimer <= 0.0)) {
      pIVar51->WheelingWindow = (ImGuiWindow *)0x0;
      pIVar51->WheelingWindowTimer = 0.0;
    }
  }
  pIVar20 = GImGui;
  fVar55 = (pIVar51->IO).MouseWheel;
  if (((((fVar55 != 0.0) || (fVar74 = (pIVar51->IO).MouseWheelH, fVar74 != 0.0)) || (NAN(fVar74)))
      && ((pIVar51->ActiveId == 0 || (pIVar51->ActiveIdUsingMouseWheel == false)))) &&
     (((pIVar51->HoveredIdPreviousFrame == 0 ||
       (pIVar51->HoveredIdPreviousFrameUsingMouseWheel == false)) &&
      (((pIVar30 = pIVar51->WheelingWindow, pIVar30 != (ImGuiWindow *)0x0 ||
        (pIVar30 = pIVar51->HoveredWindow, pIVar30 != (ImGuiWindow *)0x0)) &&
       (pIVar30->Collapsed == false)))))) {
    bVar23 = (pIVar51->IO).KeyCtrl;
    if ((fVar55 != 0.0) || (NAN(fVar55))) {
      if ((bVar23 & 1U) == 0) goto LAB_00143aee;
      if ((pIVar51->IO).FontAllowUserScaling == true) {
        if (GImGui->WheelingWindow != pIVar30) {
          GImGui->WheelingWindow = pIVar30;
          pIVar20->WheelingWindowRefMousePos = (pIVar20->IO).MousePos;
          pIVar20->WheelingWindowTimer = 2.0;
          fVar55 = (pIVar51->IO).MouseWheel;
        }
        fVar74 = pIVar30->FontWindowScale;
        fVar65 = fVar55 * 0.1 + fVar74;
        fVar55 = 2.5;
        if (fVar65 <= 2.5) {
          fVar55 = fVar65;
        }
        fVar55 = (float)(-(uint)(fVar65 < 0.5) & 0x3f000000 | ~-(uint)(fVar65 < 0.5) & (uint)fVar55)
        ;
        pIVar30->FontWindowScale = fVar55;
        if (pIVar30 == pIVar30->RootWindow) {
          fVar55 = fVar55 / fVar74;
          IVar56 = pIVar30->Size;
          auVar70._8_8_ = 0;
          auVar70._0_4_ = IVar56.x;
          auVar70._4_4_ = IVar56.y;
          IVar57 = (pIVar51->IO).MousePos;
          fVar74 = (pIVar30->Pos).x;
          fVar65 = (pIVar30->Pos).y;
          auVar72._0_4_ = (IVar57.x - fVar74) * (1.0 - fVar55) * IVar56.x;
          auVar72._4_4_ = (IVar57.y - fVar65) * (1.0 - fVar55) * IVar56.y;
          auVar72._8_8_ = 0;
          auVar73 = divps(auVar72,auVar70);
          local_48.Min.x = auVar73._0_4_ + fVar74;
          local_48.Min.y = auVar73._4_4_ + fVar65;
          SetWindowPos(pIVar30,&local_48.Min,0);
          IVar56 = pIVar30->SizeFull;
          IVar60.x = (float)(int)((pIVar30->Size).x * fVar55);
          IVar60.y = (float)(int)((pIVar30->Size).y * fVar55);
          pIVar30->Size = IVar60;
          (pIVar30->SizeFull).x = (float)(int)(IVar56.x * fVar55);
          (pIVar30->SizeFull).y = (float)(int)(IVar56.y * fVar55);
        }
      }
    }
    else if ((bVar23 & 1U) == 0) {
LAB_00143aee:
      if (((pIVar51->IO).KeyShift != true) ||
         (fVar74 = fVar55, (pIVar51->IO).ConfigMacOSXBehaviors == true)) {
        fVar74 = (pIVar51->IO).MouseWheelH;
        if ((fVar55 != 0.0) || (NAN(fVar55))) {
          if (GImGui->WheelingWindow != pIVar30) {
            GImGui->WheelingWindow = pIVar30;
            pIVar20->WheelingWindowRefMousePos = (pIVar20->IO).MousePos;
            pIVar20->WheelingWindowTimer = 2.0;
          }
          uVar27 = pIVar30->Flags;
          while (((uVar27 >> 0x18 & 1) != 0 &&
                 (((uVar27 & 0x210) == 0x10 ||
                  ((fVar65 = (pIVar30->ScrollMax).y, fVar65 == 0.0 && (!NAN(fVar65)))))))) {
            pIVar30 = pIVar30->ParentWindow;
            uVar27 = pIVar30->Flags;
          }
          if ((uVar27 & 0x210) == 0) {
            fVar65 = ((pIVar30->InnerRect).Max.y - (pIVar30->InnerRect).Min.y) * 0.67;
            fVar71 = pIVar20->FontBaseSize * pIVar30->FontWindowScale;
            if (pIVar30->ParentWindow != (ImGuiWindow *)0x0) {
              fVar71 = fVar71 * pIVar30->ParentWindow->FontWindowScale;
            }
            fVar67 = fVar71 * 5.0;
            if (fVar65 <= fVar71 * 5.0) {
              fVar67 = fVar65;
            }
            (pIVar30->ScrollTarget).y = (pIVar30->Scroll).y - fVar55 * (float)(int)fVar67;
            (pIVar30->ScrollTargetCenterRatio).y = 0.0;
            (pIVar30->ScrollTargetEdgeSnapDist).y = 0.0;
          }
        }
      }
      pIVar51 = GImGui;
      if ((fVar74 != 0.0) || (NAN(fVar74))) {
        if (GImGui->WheelingWindow != pIVar30) {
          GImGui->WheelingWindow = pIVar30;
          pIVar51->WheelingWindowRefMousePos = (pIVar51->IO).MousePos;
          pIVar51->WheelingWindowTimer = 2.0;
        }
        while ((uVar27 = pIVar30->Flags, (uVar27 >> 0x18 & 1) != 0 &&
               (((uVar27 & 0x210) == 0x10 ||
                ((fVar55 = (pIVar30->ScrollMax).x, fVar55 == 0.0 && (!NAN(fVar55)))))))) {
          pIVar30 = pIVar30->ParentWindow;
        }
        if ((uVar27 & 0x210) == 0) {
          fVar55 = ((pIVar30->InnerRect).Max.x - (pIVar30->InnerRect).Min.x) * 0.67;
          fVar65 = pIVar51->FontBaseSize * pIVar30->FontWindowScale;
          if (pIVar30->ParentWindow != (ImGuiWindow *)0x0) {
            fVar65 = fVar65 * pIVar30->ParentWindow->FontWindowScale;
          }
          fVar71 = fVar65 + fVar65;
          if (fVar55 <= fVar65 + fVar65) {
            fVar71 = fVar55;
          }
          (pIVar30->ScrollTarget).x = (pIVar30->Scroll).x - fVar74 * (float)(int)fVar71;
          (pIVar30->ScrollTargetCenterRatio).x = 0.0;
          (pIVar30->ScrollTargetEdgeSnapDist).x = 0.0;
        }
      }
    }
  }
  pIVar51 = GImGui;
  pIVar30 = GImGui->NavWindow;
  if ((((pIVar30 == (ImGuiWindow *)0x0) || (pIVar30->Active != true)) ||
      ((pIVar30->Flags & 0x40000) != 0)) ||
     (((GImGui->IO).KeyCtrl != false || (iVar37 = (GImGui->IO).KeyMap[0], iVar37 < 0)))) {
    GImGui->TabFocusPressed = false;
LAB_001432b5:
    pIVar30 = pIVar51->TabFocusRequestNextWindow;
  }
  else {
    bVar23 = IsKeyPressed(iVar37,true);
    pIVar51->TabFocusPressed = bVar23;
    if ((!bVar23) || (pIVar51->ActiveId != 0)) goto LAB_001432b5;
    pIVar30 = pIVar51->NavWindow;
    pIVar51->TabFocusRequestNextWindow = pIVar30;
    pIVar51->TabFocusRequestNextCounterRegular = 0x7fffffff;
    if ((pIVar51->NavId == 0) || (pIVar51->NavIdTabCounter == 0x7fffffff)) {
      iVar37 = -(uint)(pIVar51->IO).KeyShift;
    }
    else {
      iVar37 = pIVar51->NavIdTabCounter - (uint)(pIVar51->IO).KeyShift;
    }
    pIVar51->TabFocusRequestNextCounterTabStop = iVar37;
  }
  pIVar51->TabFocusRequestCurrWindow = (ImGuiWindow *)0x0;
  pIVar51->TabFocusRequestCurrCounterRegular = 0x7fffffff;
  pIVar51->TabFocusRequestCurrCounterTabStop = 0x7fffffff;
  if (pIVar30 != (ImGuiWindow *)0x0) {
    pIVar51->TabFocusRequestCurrWindow = pIVar30;
    if ((pIVar51->TabFocusRequestNextCounterRegular != 0x7fffffff) &&
       (iVar37 = (pIVar30->DC).FocusCounterRegular, iVar37 != -1)) {
      pIVar51->TabFocusRequestCurrCounterRegular =
           (pIVar51->TabFocusRequestNextCounterRegular + iVar37 + 1) % (iVar37 + 1);
    }
    if ((pIVar51->TabFocusRequestNextCounterTabStop != 0x7fffffff) &&
       (iVar37 = (pIVar30->DC).FocusCounterTabStop, iVar37 != -1)) {
      pIVar51->TabFocusRequestCurrCounterTabStop =
           (pIVar51->TabFocusRequestNextCounterTabStop + iVar37 + 1) % (iVar37 + 1);
    }
    pIVar51->TabFocusRequestNextWindow = (ImGuiWindow *)0x0;
    pIVar51->TabFocusRequestNextCounterRegular = 0x7fffffff;
    pIVar51->TabFocusRequestNextCounterTabStop = 0x7fffffff;
  }
  pIVar51->NavIdTabCounter = 0x7fffffff;
  uVar27 = (pIVar19->Windows).Size;
  if ((int)uVar27 < (pIVar19->WindowsFocusOrder).Size) {
    __assert_fail("g.WindowsFocusOrder.Size <= g.Windows.Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0xfd7,"void ImGui::NewFrame()");
  }
  fVar55 = 3.4028235e+38;
  if ((pIVar19->GcCompactAll == false) &&
     (fVar74 = (pIVar19->IO).ConfigMemoryCompactTimer, 0.0 <= fVar74)) {
    fVar55 = (float)pIVar19->Time - fVar74;
  }
  if (uVar27 != 0) {
    uVar47 = 0;
    do {
      if ((long)(int)uVar27 <= (long)uVar47) {
        pcVar35 = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
        goto LAB_001440a5;
      }
      pIVar30 = (pIVar19->Windows).Data[uVar47];
      bVar23 = pIVar30->Active;
      pIVar30->WasActive = bVar23;
      pIVar30->BeginCount = 0;
      pIVar30->Active = false;
      pIVar30->WriteAccessed = false;
      if (((bVar23 == false) && (pIVar30->MemoryCompacted == false)) &&
         (pIVar30->LastTimeActive <= fVar55 && fVar55 != pIVar30->LastTimeActive)) {
        GcCompactTransientWindowBuffers(pIVar30);
        uVar27 = (pIVar19->Windows).Size;
      }
      uVar47 = uVar47 + 1;
    } while (uVar47 != uVar27);
  }
  iVar37 = (pIVar19->TablesLastTimeActive).Size;
  if (0 < iVar37) {
    lVar48 = 0;
    lVar52 = 0;
    do {
      fVar74 = (pIVar19->TablesLastTimeActive).Data[lVar52];
      if ((0.0 <= fVar74) && (fVar74 < fVar55)) {
        if ((pIVar19->Tables).Buf.Size <= lVar52) {
          pcVar35 = "T &ImVector<ImGuiTable>::operator[](int) [T = ImGuiTable]";
          goto LAB_001440a5;
        }
        TableGcCompactTransientBuffers
                  ((ImGuiTable *)((long)&((pIVar19->Tables).Buf.Data)->ID + lVar48));
        iVar37 = (pIVar19->TablesLastTimeActive).Size;
      }
      lVar52 = lVar52 + 1;
      lVar48 = lVar48 + 0x1e8;
    } while (lVar52 < iVar37);
  }
  iVar37 = (pIVar19->TablesTempDataStack).Size;
  if (0 < iVar37) {
    lVar48 = 0;
    lVar52 = 0;
    do {
      pIVar13 = (pIVar19->TablesTempDataStack).Data;
      fVar74 = *(float *)((long)&pIVar13->LastTimeActive + lVar48);
      if ((0.0 <= fVar74) && (fVar74 < fVar55)) {
        TableGcCompactTransientBuffers((ImGuiTableTempData *)((long)&pIVar13->TableIndex + lVar48));
        iVar37 = (pIVar19->TablesTempDataStack).Size;
      }
      lVar52 = lVar52 + 1;
      lVar48 = lVar48 + 0x90;
    } while (lVar52 < iVar37);
  }
  if (pIVar19->GcCompactAll != false) {
    GcCompactTransientMiscBuffers();
  }
  pIVar19->GcCompactAll = false;
  if ((pIVar19->NavWindow != (ImGuiWindow *)0x0) && (pIVar19->NavWindow->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  if ((pIVar19->CurrentWindowStack).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar32 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar32 = *piVar32 + 1;
    }
    __dest_00 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    ppIVar14 = (pIVar19->CurrentWindowStack).Data;
    if (ppIVar14 != (ImGuiWindow **)0x0) {
      memcpy(__dest_00,ppIVar14,(long)(pIVar19->CurrentWindowStack).Size << 3);
      ppIVar14 = (pIVar19->CurrentWindowStack).Data;
      if ((ppIVar14 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar32 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar32 = *piVar32 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar14,GImAllocatorUserData);
    }
    (pIVar19->CurrentWindowStack).Data = __dest_00;
    (pIVar19->CurrentWindowStack).Capacity = 0;
  }
  (pIVar19->CurrentWindowStack).Size = 0;
  if ((pIVar19->BeginPopupStack).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar32 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar32 = *piVar32 + 1;
    }
    __dest_01 = (ImGuiPopupData *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pIVar15 = (pIVar19->BeginPopupStack).Data;
    if (pIVar15 != (ImGuiPopupData *)0x0) {
      memcpy(__dest_01,pIVar15,(long)(pIVar19->BeginPopupStack).Size * 0x30);
      pIVar15 = (pIVar19->BeginPopupStack).Data;
      if ((pIVar15 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar32 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar32 = *piVar32 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar15,GImAllocatorUserData);
    }
    (pIVar19->BeginPopupStack).Data = __dest_01;
    (pIVar19->BeginPopupStack).Capacity = 0;
  }
  (pIVar19->BeginPopupStack).Size = 0;
  iVar37 = (pIVar19->ItemFlagsStack).Capacity;
  if (iVar37 < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar32 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar32 = *piVar32 + 1;
    }
    piVar31 = (int *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    piVar32 = (pIVar19->ItemFlagsStack).Data;
    if (piVar32 != (int *)0x0) {
      memcpy(piVar31,piVar32,(long)(pIVar19->ItemFlagsStack).Size << 2);
      piVar32 = (pIVar19->ItemFlagsStack).Data;
      if ((piVar32 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar3 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar3 = *piVar3 + -1;
      }
      (*GImAllocatorFreeFunc)(piVar32,GImAllocatorUserData);
    }
    (pIVar19->ItemFlagsStack).Data = piVar31;
    (pIVar19->ItemFlagsStack).Size = 0;
    (pIVar19->ItemFlagsStack).Capacity = 0;
  }
  else {
    (pIVar19->ItemFlagsStack).Size = 0;
    if (iVar37 != 0) {
      piVar32 = (pIVar19->ItemFlagsStack).Data;
      lVar48 = 0;
      goto LAB_00143762;
    }
  }
  if (GImGui != (ImGuiContext *)0x0) {
    piVar32 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar32 = *piVar32 + 1;
  }
  piVar32 = (int *)(*GImAllocatorAllocFunc)(0x20,GImAllocatorUserData);
  piVar31 = (pIVar19->ItemFlagsStack).Data;
  if (piVar31 != (int *)0x0) {
    memcpy(piVar32,piVar31,(long)(pIVar19->ItemFlagsStack).Size << 2);
    piVar31 = (pIVar19->ItemFlagsStack).Data;
    if ((piVar31 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
      piVar3 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar3 = *piVar3 + -1;
    }
    (*GImAllocatorFreeFunc)(piVar31,GImAllocatorUserData);
  }
  (pIVar19->ItemFlagsStack).Data = piVar32;
  (pIVar19->ItemFlagsStack).Capacity = 8;
  lVar48 = (long)(pIVar19->ItemFlagsStack).Size;
LAB_00143762:
  piVar32[lVar48] = 0;
  (pIVar19->ItemFlagsStack).Size = (pIVar19->ItemFlagsStack).Size + 1;
  if ((pIVar19->GroupStack).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar32 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar32 = *piVar32 + 1;
    }
    __dest_02 = (ImGuiGroupData *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pIVar16 = (pIVar19->GroupStack).Data;
    if (pIVar16 != (ImGuiGroupData *)0x0) {
      memcpy(__dest_02,pIVar16,(long)(pIVar19->GroupStack).Size * 0x30);
      pIVar16 = (pIVar19->GroupStack).Data;
      if ((pIVar16 != (ImGuiGroupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar32 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar32 = *piVar32 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar16,GImAllocatorUserData);
    }
    (pIVar19->GroupStack).Data = __dest_02;
    (pIVar19->GroupStack).Capacity = 0;
  }
  (pIVar19->GroupStack).Size = 0;
  ClosePopupsOverWindow(pIVar19->NavWindow,false);
  pIVar51 = GImGui;
  GImGui->DebugItemPickerBreakId = 0;
  if (pIVar51->DebugItemPickerActive == true) {
    uVar27 = pIVar51->HoveredIdPreviousFrame;
    pIVar51->MouseCursor = 7;
    iVar37 = (pIVar51->IO).KeyMap[0xe];
    if ((-1 < iVar37) && (bVar23 = IsKeyPressed(iVar37,true), bVar23)) {
      pIVar51->DebugItemPickerActive = false;
    }
    pIVar20 = GImGui;
    fVar55 = (GImGui->IO).MouseDownDuration[0];
    if ((fVar55 != 0.0) || (NAN(fVar55))) {
      uVar54 = (uint)(uVar27 == 0);
    }
    else if (uVar27 == 0) {
      uVar54 = 1;
    }
    else {
      pIVar51->DebugItemPickerBreakId = uVar27;
      pIVar51->DebugItemPickerActive = false;
      uVar54 = 0;
    }
    pIVar4 = &pIVar20->NextWindowData;
    *(byte *)&pIVar4->Flags = (byte)pIVar4->Flags | 0x40;
    (pIVar20->NextWindowData).BgAlphaVal = 0.6;
    BeginTooltipEx(0,0);
    Text("HoveredId: 0x%08X",(ulong)uVar27);
    Text("Press ESC to abort picking.");
    TextColored((ImVec4 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar54 << 4)),
                "Click to break in debugger!");
    EndTooltip();
    pIVar51 = GImGui;
  }
  pIVar19->WithinFrameScopeWithImplicitWindow = true;
  *(byte *)&(pIVar51->NextWindowData).Flags = (byte)(pIVar51->NextWindowData).Flags | 2;
  (pIVar51->NextWindowData).SizeVal.x = 400.0;
  (pIVar51->NextWindowData).SizeVal.y = 400.0;
  (pIVar51->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  if (pIVar19->CurrentWindow->IsFallbackWindow != false) {
    iVar37 = (pIVar19->Hooks).Size;
    if (0 < iVar37) {
      lVar48 = 0;
      lVar52 = 0;
      do {
        pIVar9 = (pIVar19->Hooks).Data;
        if (*(int *)(pIVar9 + lVar48 + 4) == 1) {
          (**(code **)(pIVar9 + lVar48 + 0x10))(pIVar19,pIVar9 + lVar48);
          iVar37 = (pIVar19->Hooks).Size;
        }
        lVar52 = lVar52 + 1;
        lVar48 = lVar48 + 0x20;
      } while (lVar52 < iVar37);
    }
    return;
  }
  __assert_fail("g.CurrentWindow->IsFallbackWindow == true",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                ,0x1007,"void ImGui::NewFrame()");
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

    // Remove pending delete hooks before frame start.
    // This deferred removal avoid issues of removal while iterating the hook vector
    for (int n = g.Hooks.Size - 1; n >= 0; n--)
        if (g.Hooks[n].Type == ImGuiContextHookType_PendingRemoval_)
            g.Hooks.erase(&g.Hooks[n]);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePre);

    // Check and assert for various common IO and Configuration mistakes
    ErrorCheckNewFrameSanityChecks();

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.FramerateSecPerFrameCount = ImMin(g.FramerateSecPerFrameCount + 1, IM_ARRAYSIZE(g.FramerateSecPerFrame));
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)g.FramerateSecPerFrameCount)) : FLT_MAX;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetMainRect());
    g.DrawListSharedData.ClipRectFullscreen = virtual_space.ToVec4();
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleTessellationMaxError(g.Style.CircleTessellationMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredIdPreviousFrameUsingMouseWheel = g.HoveredIdUsingMouseWheel;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdUsingMouseWheel = false;
    g.HoveredIdDisabled = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask = 0x00;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Update keyboard input state
    // Synchronize io.KeyMods with individual modifiers io.KeyXXX bools
    g.IO.KeyMods = GetMergedKeyModFlags();
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Update legacy TAB focus
    UpdateTabFocus();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size <= g.Windows.Size);
    const float memory_compact_start_time = (g.GcCompactAll || g.IO.ConfigMemoryCompactTimer < 0.0f) ? FLT_MAX : (float)g.Time - g.IO.ConfigMemoryCompactTimer;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Garbage collect transient buffers of recently unused tables
    for (int i = 0; i < g.TablesLastTimeActive.Size; i++)
        if (g.TablesLastTimeActive[i] >= 0.0f && g.TablesLastTimeActive[i] < memory_compact_start_time)
            TableGcCompactTransientBuffers(g.Tables.GetByIndex(i));
    for (int i = 0; i < g.TablesTempDataStack.Size; i++)
        if (g.TablesTempDataStack[i].LastTimeActive >= 0.0f && g.TablesTempDataStack[i].LastTimeActive < memory_compact_start_time)
            TableGcCompactTransientBuffers(&g.TablesTempDataStack[i]);
    if (g.GcCompactAll)
        GcCompactTransientMiscBuffers();
    g.GcCompactAll = false;

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    g.ItemFlagsStack.resize(0);
    g.ItemFlagsStack.push_back(ImGuiItemFlags_None);
    g.GroupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // [DEBUG] Item picker tool - start with DebugStartItemPicker() - useful to visually select an item and break into its call-stack.
    UpdateDebugToolItemPicker();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePost);
}